

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_reset(tsd_t *tsd,arena_t *arena)

{
  rtree_ctx_t *rtree_ctx;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *mutex;
  pthread_mutex_t *ppVar3;
  ulong *puVar4;
  bin_t *mutex_00;
  undefined8 *puVar5;
  undefined8 *puVar6;
  void *pvVar7;
  bin_t *pbVar8;
  extent_t *peVar9;
  extent_t *peVar10;
  undefined8 uVar11;
  int iVar12;
  extent_t *peVar13;
  ulong uVar14;
  rtree_leaf_elm_t *prVar15;
  ulong uVar16;
  long lVar17;
  mutex_prof_data_t *data_2;
  mutex_prof_data_t *data;
  extent_hooks_t *local_50;
  malloc_mutex_t *local_48;
  uint32_t *local_40;
  long local_38;
  
  mutex = &arena->large_mtx;
  ppVar3 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x40);
  iVar12 = pthread_mutex_trylock(ppVar3);
  if (iVar12 != 0) {
    malloc_mutex_lock_slow(mutex);
    (arena->large_mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &(arena->large_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  peVar13 = (arena->large).qlh_first;
  local_48 = mutex;
  if (peVar13 != (extent_t *)0x0) {
    rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    do {
      pvVar7 = peVar13->e_addr;
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar3);
      uVar16 = (ulong)pvVar7 & 0xffffffffc0000000;
      uVar14 = (ulong)(((uint)((ulong)pvVar7 >> 0x1e) & 0xf) << 4);
      puVar4 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar14);
      uVar14 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar14);
      if (uVar14 != uVar16) {
        if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
            leafkey == uVar16) {
          prVar15 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache
                    [0].leaf;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey
               = uVar14;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
               (rtree_leaf_elm_t *)puVar4[1];
LAB_00116788:
          *puVar4 = uVar16;
          puVar4[1] = (ulong)prVar15;
        }
        else {
          lVar17 = 0x148;
          do {
            if (*(ulong *)((long)(tsd->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                 cache + lVar17 + -0x38) == uVar16) {
              prVar15 = *(rtree_leaf_elm_t **)
                         ((long)((tsd->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                 cache + -3) + lVar17);
              puVar5 = (undefined8 *)
                       ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx)
                              .cache + lVar17 + -0x48);
              uVar11 = puVar5[1];
              puVar6 = (undefined8 *)
                       ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx)
                              .cache + lVar17 + -0x38);
              *puVar6 = *puVar5;
              puVar6[1] = uVar11;
              *(ulong *)((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                               ).cache + lVar17 + -0x48) = uVar14;
              *(ulong *)((long)((tsd->
                                cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                cache + -4) + lVar17) = puVar4[1];
              goto LAB_00116788;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x1b8);
          rtree_leaf_elm_lookup_hard
                    ((tsdn_t *)tsd,&extents_rtree,rtree_ctx,(ulong)pvVar7 & 0xfffffffffffff000,true,
                     false);
        }
      }
      large_dalloc((tsdn_t *)tsd,peVar13);
      iVar12 = pthread_mutex_trylock(ppVar3);
      if (iVar12 != 0) {
        malloc_mutex_lock_slow(local_48);
        (arena->large_mtx).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar2 = &(arena->large_mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      peVar13 = (arena->large).qlh_first;
    } while (peVar13 != (extent_t *)0x0);
  }
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar3);
  local_38 = 0;
  do {
    if (bin_infos[local_38].n_shards != 0) {
      local_40 = &bin_infos[local_38].n_shards;
      local_48 = (malloc_mutex_t *)0x0;
      do {
        pbVar8 = arena->bins[local_38].bin_shards;
        mutex_00 = pbVar8 + (long)local_48;
        ppVar3 = (pthread_mutex_t *)((long)&pbVar8[(long)local_48].lock.field_0 + 0x40);
        iVar12 = pthread_mutex_trylock(ppVar3);
        if (iVar12 != 0) {
          malloc_mutex_lock_slow(&mutex_00->lock);
          (mutex_00->lock).field_0.field_0.locked.repr = true;
        }
        puVar1 = &(mutex_00->lock).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if (&((mutex_00->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
          (mutex_00->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
          ppwVar2 = &(mutex_00->lock).field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
        peVar13 = mutex_00->slabcur;
        if (peVar13 != (extent_t *)0x0) {
          mutex_00->slabcur = (extent_t *)0x0;
          (mutex_00->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar3);
          LOCK();
          (arena->nactive).repr = (arena->nactive).repr - ((peVar13->field_2).e_size_esn >> 0xc);
          UNLOCK();
          local_50 = (extent_hooks_t *)0x0;
          arena_extents_dirty_dalloc((tsdn_t *)tsd,arena,&local_50,peVar13);
          iVar12 = pthread_mutex_trylock(ppVar3);
          if (iVar12 != 0) {
            malloc_mutex_lock_slow(&mutex_00->lock);
            (mutex_00->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(mutex_00->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (&((mutex_00->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (mutex_00->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar2 = &(mutex_00->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
        }
        peVar13 = extent_heap_remove_first(&mutex_00->slabs_nonfull);
        while (peVar13 != (extent_t *)0x0) {
          (mutex_00->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar3);
          LOCK();
          (arena->nactive).repr = (arena->nactive).repr - ((peVar13->field_2).e_size_esn >> 0xc);
          UNLOCK();
          local_50 = (extent_hooks_t *)0x0;
          arena_extents_dirty_dalloc((tsdn_t *)tsd,arena,&local_50,peVar13);
          iVar12 = pthread_mutex_trylock(ppVar3);
          if (iVar12 != 0) {
            malloc_mutex_lock_slow(&mutex_00->lock);
            (mutex_00->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(mutex_00->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (&((mutex_00->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (mutex_00->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar2 = &(mutex_00->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          peVar13 = extent_heap_remove_first(&mutex_00->slabs_nonfull);
        }
        peVar13 = (mutex_00->slabs_full).qlh_first;
        while (peVar13 != (extent_t *)0x0) {
          if (manual_arena_base <= arena->base->ind) {
            peVar9 = (peVar13->ql_link).qre_next;
            (mutex_00->slabs_full).qlh_first = peVar9;
            if (peVar9 == peVar13) {
              (mutex_00->slabs_full).qlh_first = (extent_t *)0x0;
            }
            else {
              peVar10 = (peVar13->ql_link).qre_prev;
              (peVar10->ql_link).qre_next = peVar9;
              (peVar9->ql_link).qre_prev = peVar10;
              (peVar13->ql_link).qre_next = peVar13;
              (peVar13->ql_link).qre_prev = peVar13;
            }
          }
          (mutex_00->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar3);
          LOCK();
          (arena->nactive).repr = (arena->nactive).repr - ((peVar13->field_2).e_size_esn >> 0xc);
          UNLOCK();
          local_50 = (extent_hooks_t *)0x0;
          arena_extents_dirty_dalloc((tsdn_t *)tsd,arena,&local_50,peVar13);
          iVar12 = pthread_mutex_trylock(ppVar3);
          if (iVar12 != 0) {
            malloc_mutex_lock_slow(&mutex_00->lock);
            (mutex_00->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(mutex_00->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (&((mutex_00->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (mutex_00->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar2 = &(mutex_00->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          peVar13 = (mutex_00->slabs_full).qlh_first;
        }
        (mutex_00->stats).curregs = 0;
        (mutex_00->stats).curslabs = 0;
        (mutex_00->lock).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(ppVar3);
        local_48 = (malloc_mutex_t *)((long)local_48 + 1);
      } while (local_48 < (ulong)*local_40);
    }
    local_38 = local_38 + 1;
  } while (local_38 != 0x24);
  (arena->nactive).repr = 0;
  return;
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (extent_t *extent = extent_list_first(&arena->large); extent !=
	    NULL; extent = extent_list_first(&arena->large)) {
		void *ptr = extent_base_get(extent);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		alloc_ctx_t alloc_ctx;
		rtree_ctx_t *rtree_ctx = tsd_rtree_ctx(tsd);
		rtree_szind_slab_read(tsd_tsdn(tsd), &extents_rtree, rtree_ctx,
		    (uintptr_t)ptr, true, &alloc_ctx.szind, &alloc_ctx.slab);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		large_dalloc(tsd_tsdn(tsd), extent);
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena,
			    &arena->bins[i].bin_shards[j]);
		}
	}

	atomic_store_zu(&arena->nactive, 0, ATOMIC_RELAXED);
}